

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  WeightParams *pWVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  LayerUnion LVar13;
  Rep *pRVar14;
  int iVar15;
  int iVar16;
  Result res1;
  Model m;
  Result res3;
  Result res2;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Model local_a0;
  Result local_70;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_a0);
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_a0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar2) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar16 = (pAVar9->shape_).current_size_;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar16 + 1);
    iVar16 = (pAVar9->shape_).current_size_;
    iVar15 = (pAVar9->shape_).total_size_;
  }
  pRVar14 = (pAVar9->shape_).rep_;
  iVar5 = iVar16 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar14->elements[iVar16] = 3;
  if (iVar5 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar16 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar15 = (pAVar9->shape_).total_size_;
    pRVar14 = (pAVar9->shape_).rep_;
  }
  iVar16 = iVar5 + 1;
  pRVar1->current_size_ = iVar16;
  pRVar14->elements[iVar5] = 5;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar16 = (pAVar9->shape_).current_size_;
    pRVar14 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar16 + 1;
  pRVar14->elements[iVar16] = 2;
  if (local_a0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_a0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_a0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar2) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar16 = (pAVar9->shape_).current_size_;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar16 + 1);
    iVar16 = (pAVar9->shape_).current_size_;
    iVar15 = (pAVar9->shape_).total_size_;
  }
  pRVar14 = (pAVar9->shape_).rep_;
  iVar5 = iVar16 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar14->elements[iVar16] = 3;
  if (iVar5 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar16 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar15 = (pAVar9->shape_).total_size_;
    pRVar14 = (pAVar9->shape_).rep_;
  }
  iVar16 = iVar5 + 1;
  pRVar1->current_size_ = iVar16;
  pRVar14->elements[iVar5] = 5;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar16 = (pAVar9->shape_).current_size_;
    pRVar14 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar16 + 1;
  pRVar14->elements[iVar16] = 2;
  if (local_a0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_a0);
    local_a0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_a0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_a0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_a0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 0x4a6) {
    LVar13 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x4a6;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    CoreML::Specification::RandomUniformLikeLayerParams::RandomUniformLikeLayerParams
              (LVar13.randomuniformlike_);
    (this_00->layer_).randomuniformlike_ = (RandomUniformLikeLayerParams *)LVar13;
  }
  (LVar13.innerproduct_)->bias_ = (WeightParams *)0x3ecccccd3f99999a;
  CoreML::validate<(MLModelType)500>((Result *)local_c8,&local_a0);
  bVar4 = CoreML::Result::good((Result *)local_c8);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1626);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_((Result *)local_c8);
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2aa0,0);
    if (lVar12 != -1) {
      if (this_00->_oneof_case_[0] == 0x4ab) {
        LVar13 = this_00->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
        this_00->_oneof_case_[0] = 0x4ab;
        LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
        CoreML::Specification::RandomUniformStaticLayerParams::RandomUniformStaticLayerParams
                  (LVar13.randomuniformstatic_);
        (this_00->layer_).randomuniformstatic_ = (RandomUniformStaticLayerParams *)LVar13;
      }
      iVar16 = ((LVar13.convolution_)->kernelsize_).current_size_;
      if (iVar16 == ((LVar13.convolution_)->kernelsize_).total_size_) {
        google::protobuf::RepeatedField<unsigned_long>::Reserve
                  (&(LVar13.convolution_)->kernelsize_,iVar16 + 1);
        iVar16 = ((LVar13.convolution_)->kernelsize_).current_size_;
      }
      pWVar3 = (LVar13.innerproduct_)->bias_;
      ((LVar13.convolution_)->kernelsize_).current_size_ = iVar16 + 1;
      (&pWVar3->_internal_metadata_)[iVar16].
      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
      .ptr_ = (void *)0x3;
      (LVar13.cropresize_)->boxindicesmode_ = (BoxCoordinatesMode *)0x3ecccccd3f99999a;
      CoreML::validate<(MLModelType)500>(&local_48,&local_a0);
      bVar4 = CoreML::Result::good(&local_48);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x162f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
LAB_00189465:
        std::ostream::put((char)poVar10);
        iVar16 = 1;
        std::ostream::flush();
      }
      else {
        psVar11 = CoreML::Result::message_abi_cxx11_(&local_48);
        lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2aa0,0);
        if (lVar12 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1630);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"res2.message().find(\"smaller\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          goto LAB_00189465;
        }
        if (this_00->_oneof_case_[0] == 0x4b0) {
          LVar13 = this_00->layer_;
        }
        else {
          CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
          this_00->_oneof_case_[0] = 0x4b0;
          LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
          CoreML::Specification::RandomUniformDynamicLayerParams::RandomUniformDynamicLayerParams
                    (LVar13.randomuniformdynamic_);
          (this_00->layer_).randomuniformdynamic_ = (RandomUniformDynamicLayerParams *)LVar13;
        }
        (LVar13.innerproduct_)->bias_ = (WeightParams *)0x3ecccccd3f99999a;
        CoreML::validate<(MLModelType)500>(&local_70,&local_a0);
        bVar4 = CoreML::Result::good(&local_70);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1637);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          iVar16 = 1;
          std::ostream::flush();
        }
        else {
          psVar11 = CoreML::Result::message_abi_cxx11_(&local_70);
          iVar16 = 0;
          lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2aa0,0);
          if (lVar12 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1638);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"res3.message().find(\"smaller\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," was false, expected true.",0x1a);
            iVar16 = 1;
            std::endl<char,std::char_traits<char>>(poVar10);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
          operator_delete(local_70.m_message._M_dataplus._M_p,
                          local_70.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
        operator_delete(local_48.m_message._M_dataplus._M_p,
                        local_48.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00189685;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1627);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"res1.message().find(\"smaller\") != std::string::npos",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar16 = 1;
  std::ostream::flush();
LAB_00189685:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._8_8_ != &local_b0) {
    operator_delete((void *)local_c8._8_8_,local_b0._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_a0);
  return iVar16;
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}